

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,exr_const_context_t ctxt,
          exr_const_priv_part_t part)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  exr_attr_chlist_t *peVar4;
  exr_attr_chlist_entry_t *peVar5;
  int iVar6;
  int iVar7;
  exr_result_t eVar8;
  uint16_t *puVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  
  peVar4 = (part->channels->field_6).chlist;
  uVar1 = peVar4->num_channels;
  if (5 < (long)(int)uVar1) {
    __n = (long)(int)uVar1 * 0x30;
    builtinextras = (exr_coding_channel_info_t *)(*ctxt->alloc_fn)(__n);
    if (builtinextras == (exr_coding_channel_info_t *)0x0) {
      eVar8 = (*ctxt->standard_error)(ctxt,1);
      return eVar8;
    }
    memset(builtinextras,0,__n);
  }
  lVar11 = 0;
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  puVar9 = &builtinextras->user_data_type;
  for (; uVar10 * 0x20 != lVar11; lVar11 = lVar11 + 0x20) {
    peVar5 = peVar4->entries;
    ((exr_coding_channel_info_t *)(puVar9 + -0xf))->channel_name =
         *(char **)(peVar5->reserved + lVar11 + -0xd);
    iVar2 = *(int *)(peVar5->reserved + lVar11 + 7);
    iVar6 = compute_sampled_height(cinfo->height,iVar2,cinfo->start_y);
    *(int *)(puVar9 + -0xb) = iVar6;
    iVar6 = cinfo->width;
    iVar3 = *(int *)(peVar5->reserved + lVar11 + 3);
    iVar7 = iVar6;
    if ((1 < iVar3) && (iVar7 = 1, iVar6 != 1)) {
      iVar7 = iVar6 / iVar3;
    }
    *(int *)(puVar9 + -9) = iVar7;
    *(int *)(puVar9 + -7) = iVar3;
    *(int *)(puVar9 + -5) = iVar2;
    *(uint8_t *)(puVar9 + -3) = peVar5->reserved[lVar11 + -1];
    iVar2 = *(int *)(peVar5->reserved + lVar11 + -5);
    *(char *)((long)puVar9 + -5) = (iVar2 != 1) * '\x02' + '\x02';
    puVar9[-2] = (uint16_t)iVar2;
    puVar9[-1] = (ushort)(iVar2 != 1) * 2 + 2;
    *puVar9 = (uint16_t)iVar2;
    puVar9 = puVar9 + 0x18;
  }
  *channels = builtinextras;
  *num_chans = (int16_t)uVar1;
  return 0;
}

Assistant:

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t** channels,
    int16_t*                    num_chans,
    exr_coding_channel_info_t*  builtinextras,
    const exr_chunk_info_t*     cinfo,
    exr_const_context_t         ctxt,
    exr_const_priv_part_t       part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = ctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_height (
            cinfo->height, curc->y_sampling, cinfo->start_y);
        decc->width = compute_sampled_width (
            cinfo->width, curc->x_sampling, cinfo->start_x);

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}